

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O0

void __thiscall ProjectWriter::writeTimes(ProjectWriter *this)

{
  undefined1 local_30 [40];
  ProjectWriter *this_local;
  
  local_30._32_8_ = this;
  std::operator<<((ostream *)&this->field_0x18,"\n[TIMES]\n");
  Options::timeOptionsToStr_abi_cxx11_((Options *)local_30);
  std::operator<<((ostream *)&this->field_0x18,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void ProjectWriter::writeTimes()
{
    fout << "\n[TIMES]\n";
    fout << network->options.timeOptionsToStr();
}